

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O1

void idx2::WriteMetaFile(idx2_file *Idx2,params *P,cstr FileName)

{
  FILE *__s;
  name_map *pnVar1;
  dtype dVar2;
  long lVar3;
  long lVar4;
  long *in_FS_OFFSET;
  bool bVar5;
  char TransformOrder [128];
  char acStack_a8 [128];
  
  __s = fopen(FileName,"w");
  fwrite("(\n",2,1,__s);
  fwrite("  (common\n",10,1,__s);
  fwrite("    (type \"Simulation\")\n",0x18,1,__s);
  fprintf(__s,"    (name \"%s\")\n",&P->Meta);
  fprintf(__s,"    (field \"%s\")\n",(P->Meta).Field);
  fprintf(__s,"    (dimensions %d %d %d)\n",(ulong)(uint)(Idx2->Dims3).field_0.field_0.X,
          (ulong)(uint)(Idx2->Dims3).field_0.field_0.Y,(ulong)(uint)(Idx2->Dims3).field_0.field_0.Z)
  ;
  pnVar1 = &dtype_s::NameMap;
  dVar2 = dtype_s::NameMap.Arr[0].ItemVal;
  if (dtype_s::NameMap.Arr[0].ItemVal != Idx2->DType) {
    lVar3 = 0x28;
    do {
      if (lVar3 == 0x100) {
        dVar2 = __Invalid__;
        break;
      }
      dVar2 = *(dtype *)((long)&dtype_s::NameMap.Arr[0].Name.field_0 + lVar3);
      lVar3 = lVar3 + 0x18;
    } while (dVar2 != Idx2->DType);
  }
  if (dtype_s::NameMap.Arr[0].ItemVal == dVar2) {
    bVar5 = false;
  }
  else {
    lVar3 = 0;
    do {
      lVar4 = lVar3;
      bVar5 = lVar4 == 0xd8;
      if (bVar5) goto LAB_0016b8f8;
      lVar3 = lVar4 + 0x18;
    } while ((&dtype_s::NameMap.Arr[1].ItemVal)[lVar4] != dVar2);
    pnVar1 = (name_map *)((long)&dtype_s::NameMap.Arr[1].Name.field_0 + lVar4);
  }
  if (!bVar5) {
    lVar3 = *in_FS_OFFSET;
    snprintf((char *)(lVar3 + -0xf80),(long)pnVar1->Arr[0].Name.Size + 1,"%s",
             pnVar1->Arr[0].Name.field_0.Ptr);
    fprintf(__s,"    (data-type \"%s\")\n",(char *)(lVar3 + -0xf80));
    fprintf(__s,"    (min-max %.20f %.20f)\n",(Idx2->ValueRange).field_0.field_0.X,
            (Idx2->ValueRange).field_0.field_0.Y);
    fprintf(__s,"    (accuracy %.20f)\n",Idx2->Tolerance);
    fwrite("  )\n",4,1,__s);
    fwrite("  (format\n",10,1,__s);
    fprintf(__s,"    (version %d %d)\n",(ulong)(uint)(Idx2->Version).field_0.field_0.X,
            (ulong)(uint)(Idx2->Version).field_0.field_0.Y);
    fprintf(__s,"    (brick-size %d %d %d)\n",(ulong)(uint)(Idx2->BrickDims3).field_0.field_0.X,
            (ulong)(uint)(Idx2->BrickDims3).field_0.field_0.Y,
            (ulong)(uint)(Idx2->BrickDims3).field_0.field_0.Z);
    DecodeTransformOrder(Idx2->TransformOrder,acStack_a8);
    fprintf(__s,"    (transform-order \"%s\")\n",acStack_a8);
    fprintf(__s,"    (num-levels %d)\n",(ulong)(uint)(int)Idx2->NLevels);
    fprintf(__s,"    (transform-passes-per-levels %d)\n",1);
    fprintf(__s,"    (bricks-per-chunk %d)\n",(ulong)(uint)Idx2->BricksPerChunkIn);
    fprintf(__s,"    (chunks-per-file %d)\n",(ulong)(uint)Idx2->ChunksPerFileIn);
    fprintf(__s,"    (files-per-directory %d)\n",(ulong)(uint)Idx2->FilesPerDir);
    fprintf(__s,"    (bit-planes-per-chunk %d)\n",(ulong)(uint)Idx2->BitPlanesPerChunk);
    fwrite("  )\n",4,1,__s);
    fwrite(")\n",2,1,__s);
    fclose(__s);
    return;
  }
LAB_0016b8f8:
  __assert_fail("It != End(EnumS.NameMap)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataTypes.h"
                ,10,"stref idx2::ToString(dtype)");
}

Assistant:

void
WriteMetaFile(const idx2_file& Idx2, const params& P, cstr FileName)
{
  FILE* Fp = fopen(FileName, "w");
  fprintf(Fp, "(\n"); // begin (
  fprintf(Fp, "  (common\n");
  fprintf(Fp, "    (type \"Simulation\")\n"); // TODO: add this config to Idx2
  fprintf(Fp, "    (name \"%s\")\n", P.Meta.Name);
  fprintf(Fp, "    (field \"%s\")\n", P.Meta.Field);
  fprintf(Fp, "    (dimensions %d %d %d)\n", idx2_PrV3i(Idx2.Dims3));
  stref DType = ToString(Idx2.DType);
  fprintf(Fp, "    (data-type \"%s\")\n", idx2_PrintScratchN(Size(DType), "%s", DType.ConstPtr));
  fprintf(Fp, "    (min-max %.20f %.20f)\n", Idx2.ValueRange.Min, Idx2.ValueRange.Max);
  fprintf(Fp, "    (accuracy %.20f)\n", Idx2.Tolerance);
  fprintf(Fp, "  )\n"); // end common)
  fprintf(Fp, "  (format\n");
  fprintf(Fp, "    (version %d %d)\n", Idx2.Version[0], Idx2.Version[1]);
  fprintf(Fp, "    (brick-size %d %d %d)\n", idx2_PrV3i(Idx2.BrickDims3));
  char TransformOrder[128];
  DecodeTransformOrder(Idx2.TransformOrder, TransformOrder);
  fprintf(Fp, "    (transform-order \"%s\")\n", TransformOrder);
  fprintf(Fp, "    (num-levels %d)\n", Idx2.NLevels);
  fprintf(Fp, "    (transform-passes-per-levels %d)\n", Idx2.NTformPasses);
  fprintf(Fp, "    (bricks-per-chunk %d)\n", Idx2.BricksPerChunkIn);
  fprintf(Fp, "    (chunks-per-file %d)\n", Idx2.ChunksPerFileIn);
  fprintf(Fp, "    (files-per-directory %d)\n", Idx2.FilesPerDir);
  fprintf(Fp, "    (bit-planes-per-chunk %d)\n", Idx2.BitPlanesPerChunk);
  fprintf(Fp, "  )\n"); // end format)
  fprintf(Fp, ")\n");   // end )
  fclose(Fp);
}